

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_cHRM(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGInfo *info_local;
  uint local_4;
  
  if (chunkLength == 0x20) {
    info->chrm_defined = 1;
    info->chrm_white_x =
         (uint)*data * 0x1000000 + (uint)data[1] * 0x10000 + (uint)data[2] * 0x100 + (uint)data[3];
    info->chrm_white_y =
         (uint)data[4] * 0x1000000 + (uint)data[5] * 0x10000 + (uint)data[6] * 0x100 + (uint)data[7]
    ;
    info->chrm_red_x =
         (uint)data[8] * 0x1000000 + (uint)data[9] * 0x10000 + (uint)data[10] * 0x100 +
         (uint)data[0xb];
    info->chrm_red_y =
         (uint)data[0xc] * 0x1000000 + (uint)data[0xd] * 0x10000 + (uint)data[0xe] * 0x100 +
         (uint)data[0xf];
    info->chrm_green_x =
         (uint)data[0x10] * 0x1000000 + (uint)data[0x11] * 0x10000 + (uint)data[0x12] * 0x100 +
         (uint)data[0x13];
    info->chrm_green_y =
         (uint)data[0x14] * 0x1000000 + (uint)data[0x15] * 0x10000 + (uint)data[0x16] * 0x100 +
         (uint)data[0x17];
    info->chrm_blue_x =
         (uint)data[0x18] * 0x1000000 + (uint)data[0x19] * 0x10000 + (uint)data[0x1a] * 0x100 +
         (uint)data[0x1b];
    info->chrm_blue_y =
         (uint)data[0x1c] * 0x1000000 + (uint)data[0x1d] * 0x10000 + (uint)data[0x1e] * 0x100 +
         (uint)data[0x1f];
    local_4 = 0;
  }
  else {
    local_4 = 0x61;
  }
  return local_4;
}

Assistant:

static unsigned readChunk_cHRM(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  if(chunkLength != 32) return 97; /*invalid cHRM chunk size*/

  info->chrm_defined = 1;
  info->chrm_white_x = 16777216u * data[ 0] + 65536u * data[ 1] + 256u * data[ 2] + data[ 3];
  info->chrm_white_y = 16777216u * data[ 4] + 65536u * data[ 5] + 256u * data[ 6] + data[ 7];
  info->chrm_red_x   = 16777216u * data[ 8] + 65536u * data[ 9] + 256u * data[10] + data[11];
  info->chrm_red_y   = 16777216u * data[12] + 65536u * data[13] + 256u * data[14] + data[15];
  info->chrm_green_x = 16777216u * data[16] + 65536u * data[17] + 256u * data[18] + data[19];
  info->chrm_green_y = 16777216u * data[20] + 65536u * data[21] + 256u * data[22] + data[23];
  info->chrm_blue_x  = 16777216u * data[24] + 65536u * data[25] + 256u * data[26] + data[27];
  info->chrm_blue_y  = 16777216u * data[28] + 65536u * data[29] + 256u * data[30] + data[31];

  return 0; /* OK */
}